

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

CBComment * __thiscall asmjit::CodeBuilder::newCommentNode(CodeBuilder *this,char *s,size_t len)

{
  uint32_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  CBComment *pCVar3;
  size_t sStack_18;
  
  if (s == (char *)0x0) {
    s = (char *)0x0;
  }
  else {
    if (len == 0xffffffffffffffff) {
      len = strlen(s);
    }
    if (len != 0) {
      iVar2 = Zone::dup(&this->_cbDataZone,(int)s);
      s = (char *)CONCAT44(extraout_var,iVar2);
      if (s == (char *)0x0) {
        return (CBComment *)0x0;
      }
    }
  }
  if ((this->_cbHeap)._zone != (Zone *)0x0) {
    pCVar3 = (CBComment *)ZoneHeap::_alloc(&this->_cbHeap,0x28,&sStack_18);
    (pCVar3->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar3->super_CBNode)._next = (CBNode *)0x0;
    (pCVar3->super_CBNode)._type = '\a';
    (pCVar3->super_CBNode)._opCount = '\0';
    uVar1 = this->_nodeFlags;
    (pCVar3->super_CBNode)._position = this->_position;
    (pCVar3->super_CBNode)._passData = (void *)0x0;
    (pCVar3->super_CBNode)._flags = (ushort)uVar1 | 0xc;
    (pCVar3->super_CBNode)._inlineComment = s;
    return pCVar3;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/base/../base/../base/../base/../base/../base/zone.h"
             ,0x183,"isInitialized()");
}

Assistant:

CBComment* CodeBuilder::newCommentNode(const char* s, size_t len) noexcept {
  if (s) {
    if (len == Globals::kInvalidIndex) len = ::strlen(s);
    if (len > 0) {
      s = static_cast<char*>(_cbDataZone.dup(s, len, true));
      if (!s) return nullptr;
    }
  }

  return newNodeT<CBComment>(s);
}